

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

bool __thiscall
Rml::Context::ProcessMouseButtonDown(Context *this,int button_index,int key_modifier_state)

{
  Vector2i VVar1;
  ScrollController *pSVar2;
  bool bVar3;
  SystemInterface *pSVar4;
  ComputedValues *pCVar5;
  type this_00;
  Element *pEVar6;
  uint uVar7;
  Context *pCVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  bool local_6d;
  float local_6c;
  Dictionary parameters;
  Dictionary scroll_parameters;
  
  parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar8 = this;
  GenerateMouseEventParameters(this,&parameters,button_index);
  GenerateKeyModifierEventParameters(pCVar8,&parameters,key_modifier_state);
  pEVar6 = this->hover;
  if (button_index == 0) {
    if (pEVar6 == (Element *)0x0) {
      this->active = (Element *)0x0;
LAB_00257b68:
      VVar1 = this->last_click_mouse_position;
      iVar10 = (this->mouse_position).x;
      iVar9 = (this->mouse_position).y;
      local_6c = this->density_independent_pixel_ratio;
      pSVar4 = GetSystemInterface();
      (*pSVar4->_vptr_SystemInterface[2])(pSVar4);
      if (((this->active != this->last_click_element) ||
          (0.5 <= (float)((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) -
                         this->last_click_time))) ||
         (iVar10 = iVar10 - VVar1.x, iVar9 = iVar9 - VVar1.y,
         local_6c * 3.0 * local_6c * 3.0 <= (float)(iVar9 * iVar9 + iVar10 * iVar10))) {
        this->last_click_element = this->active;
        this->last_click_time = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        bVar3 = true;
      }
      else {
        if (this->hover == (Element *)0x0) {
          bVar3 = true;
        }
        else {
          bVar3 = Element::DispatchEvent(this->hover,Dblclick,&parameters);
        }
        this->last_click_element = (Element *)0x0;
        this->last_click_time = 0.0;
      }
    }
    else {
      pEVar6 = FindFocusElement(pEVar6);
      if ((pEVar6 != (Element *)0x0) && (pEVar6 != this->focus)) {
        bVar3 = Element::Focus(pEVar6,false);
        if (!bVar3) goto LAB_00257d9f;
      }
      this->active = pEVar6;
      if (this->hover == (Element *)0x0) goto LAB_00257b68;
      bVar3 = Element::DispatchEvent(this->hover,Mousedown,&parameters);
      if (bVar3) goto LAB_00257b68;
      bVar3 = false;
    }
    this->last_click_mouse_position = this->mouse_position;
    ::std::vector<Rml::Element*,std::allocator<Rml::Element*>>::
    insert<__gnu_cxx::__normal_iterator<Rml::Element**,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>,void>
              ((vector<Rml::Element*,std::allocator<Rml::Element*>> *)&this->active_chain,
               (const_iterator)
               (this->active_chain).
               super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
                )(this->hover_chain).m_container.
                 super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
                )(this->hover_chain).m_container.
                 super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    if (bVar3 != false) {
      this->drag_started = false;
      pEVar6 = this->hover;
      do {
        while( true ) {
          this->drag = pEVar6;
          if (pEVar6 == (Element *)0x0) goto LAB_00257cd5;
          pCVar5 = Element::GetComputedValues(pEVar6);
          uVar7 = *(uint *)&pCVar5->rare >> 0x14;
          if ((uVar7 & 7) != 0) break;
          pEVar6 = Element::GetParentNode(this->drag);
        }
        pEVar6 = (Element *)0x0;
      } while ((uVar7 & 7) == 3);
      this->drag_verbose = (((byte)uVar7 & 7) - 2 & 0xfd) == 0;
    }
  }
  else if (pEVar6 == (Element *)0x0) {
    bVar3 = true;
  }
  else {
    bVar3 = Element::DispatchEvent(pEVar6,Mousedown,&parameters);
  }
LAB_00257cd5:
  pSVar2 = (this->scroll_controller)._M_t.
           super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
           ._M_t.
           super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>
           .super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl;
  if (pSVar2->mode == Autoscroll) {
    ScrollController::Reset(pSVar2);
  }
  else if (((button_index == 2) && (this->hover != (Element *)0x0)) && (bVar3 != false)) {
    scroll_parameters.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    scroll_parameters.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    scroll_parameters.m_container.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pCVar8 = this;
    GenerateMouseEventParameters(this,&scroll_parameters,-1);
    GenerateKeyModifierEventParameters(pCVar8,&scroll_parameters,key_modifier_state);
    local_6d = true;
    this_00 = itlib::
              flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
              ::operator[]<char_const(&)[11]>
                        ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                          *)&scroll_parameters,(char (*) [11])"autoscroll");
    Variant::operator=(this_00,&local_6d);
    bVar3 = Element::DispatchEvent(this->hover,Mousescroll,&scroll_parameters);
    if (bVar3) {
      pSVar2 = (this->scroll_controller)._M_t.
               super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
               ._M_t.
               super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>
               .super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl;
      pEVar6 = Element::GetClosestScrollableContainer(this->hover);
      ScrollController::ActivateAutoscroll(pSVar2,pEVar6,this->mouse_position);
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ::~vector(&scroll_parameters.m_container);
  }
LAB_00257d9f:
  bVar3 = IsMouseInteracting(this);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&parameters.m_container);
  return !bVar3;
}

Assistant:

bool Context::ProcessMouseButtonDown(int button_index, int key_modifier_state)
{
	Dictionary parameters;
	GenerateMouseEventParameters(parameters, button_index);
	GenerateKeyModifierEventParameters(parameters, key_modifier_state);

	bool propagate = true;

	if (button_index == 0)
	{
		Element* new_focus = hover;

		// Set the currently hovered element to focus if it isn't already the focus.
		if (hover)
		{
			new_focus = FindFocusElement(hover);
			if (new_focus && new_focus != focus)
			{
				if (!new_focus->Focus())
					return !IsMouseInteracting();
			}
		}

		// Save the just-pressed-on element as the pressed element.
		active = new_focus;

		// Call 'onmousedown' on every item in the hover chain, and copy the hover chain to the active chain.
		if (hover)
			propagate = hover->DispatchEvent(EventId::Mousedown, parameters);

		if (propagate)
		{
			// Check for a double-click on an element; if one has occured, we send the 'dblclick' event to the hover
			// element. If not, we'll start a timer to catch the next one.
			float mouse_distance_squared = float((mouse_position - last_click_mouse_position).SquaredMagnitude());
			float max_mouse_distance = DOUBLE_CLICK_MAX_DIST * density_independent_pixel_ratio;

			double click_time = GetSystemInterface()->GetElapsedTime();

			if (active == last_click_element && float(click_time - last_click_time) < DOUBLE_CLICK_TIME &&
				mouse_distance_squared < max_mouse_distance * max_mouse_distance)
			{
				if (hover)
					propagate = hover->DispatchEvent(EventId::Dblclick, parameters);

				last_click_element = nullptr;
				last_click_time = 0;
			}
			else
			{
				last_click_element = active;
				last_click_time = click_time;
			}
		}

		last_click_mouse_position = mouse_position;

		active_chain.insert(active_chain.end(), hover_chain.begin(), hover_chain.end());

		if (propagate)
		{
			// Traverse down the hierarchy of the newly focused element (if any), and see if we can begin dragging it.
			drag_started = false;
			drag = hover;
			while (drag)
			{
				Style::Drag drag_style = drag->GetComputedValues().drag();
				switch (drag_style)
				{
				case Style::Drag::None: drag = drag->GetParentNode(); continue;
				case Style::Drag::Block: drag = nullptr; continue;
				default: drag_verbose = (drag_style == Style::Drag::DragDrop || drag_style == Style::Drag::Clone);
				}

				break;
			}
		}
	}
	else
	{
		// Not the primary mouse button, so we're not doing any special processing.
		if (hover)
			propagate = hover->DispatchEvent(EventId::Mousedown, parameters);
	}

	if (scroll_controller->GetMode() == ScrollController::Mode::Autoscroll)
	{
		scroll_controller->Reset();
	}
	else if (button_index == 2 && hover && propagate)
	{
		Dictionary scroll_parameters;
		GenerateMouseEventParameters(scroll_parameters);
		GenerateKeyModifierEventParameters(scroll_parameters, key_modifier_state);
		scroll_parameters["autoscroll"] = true;

		// Dispatch a mouse scroll event, this gives elements an opportunity to block autoscroll from being initialized.
		if (hover->DispatchEvent(EventId::Mousescroll, scroll_parameters))
			scroll_controller->ActivateAutoscroll(hover->GetClosestScrollableContainer(), mouse_position);
	}

	return !IsMouseInteracting();
}